

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

_Bool is_id_char(int32_t c)

{
  _Bool _Var1;
  uint8_t *puVar2;
  ulong uVar3;
  
  _Var1 = true;
  if ((c != 0x27) && (c != 0x5f)) {
    if (0x2f < c) {
      if (c < 0x4e01) {
        uVar3 = (ulong)(c + -0x30 >> 3);
        puVar2 = bitmap_identifier_1;
        goto LAB_0010aab4;
      }
      if (0x9ffe < c) {
        if (c < 0xac01) {
          c = c - 0x9fff;
          uVar3 = (ulong)((uint)c >> 3);
          puVar2 = bitmap_identifier_2;
          goto LAB_0010aab4;
        }
        if (0xd7a2 < c) {
          if (c < 0x20001) {
            c = c - 0xd7a3;
            uVar3 = (ulong)((uint)c >> 3);
            puVar2 = bitmap_identifier_3;
            goto LAB_0010aab4;
          }
          if (0x2a6de < c) {
            if (c < 0x323b0) {
              c = c - 0x2a6df;
              uVar3 = (ulong)((uint)c >> 3);
              puVar2 = "\x01";
LAB_0010aab4:
              return (puVar2[uVar3] >> (c & 7U) & 1) != 0;
            }
            if (c - 0xe0100U < 0xf0) {
              uVar3 = (ulong)(c - 0xe0100U >> 3);
              puVar2 = bitmap_identifier_5;
              goto LAB_0010aab4;
            }
          }
        }
      }
    }
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static bool is_id_char(const int32_t c) {
  return c == '_' || c == '\'' || is_identifier_char(c);
}